

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

ModuleDeclarationSyntax * __thiscall
slang::parsing::Parser::parseModule
          (Parser *this,AttrList attributes,SyntaxKind parentKind,bool *anyLocalModules)

{
  Token *pTVar1;
  _Storage<slang::TimeScale,_true> _Var2;
  SyntaxKind SVar3;
  Token endmodule_00;
  Token nameToken;
  bool bVar4;
  TokenKind TVar5;
  TokenKind TVar6;
  SyntaxKind parentKind_00;
  Preprocessor *this_00;
  ModuleHeaderSyntax *header_00;
  reference this_01;
  optional<slang::TimeScale> *poVar7;
  Node *pNVar8;
  ModuleDeclarationSyntax *local_160;
  size_type local_158;
  pointer local_148;
  pointer local_140;
  SyntaxList<slang::syntax::MemberSyntax> local_138;
  pointer local_108;
  size_type local_100;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_f8;
  ModuleDeclarationSyntax *local_c8;
  ModuleDeclarationSyntax *result;
  Info *local_b8;
  NamedBlockClauseSyntax *local_b0;
  NamedBlockClauseSyntax *endName;
  undefined1 local_a0 [8];
  span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> members;
  Token endmodule;
  SyntaxKind savedDefinitionKind;
  Node node;
  SyntaxKind declKind;
  undefined1 local_58 [8];
  string_view name;
  TokenKind endKind;
  ModuleHeaderSyntax *header;
  Preprocessor *pp;
  bool *anyLocalModules_local;
  SyntaxKind parentKind_local;
  Parser *this_local;
  AttrList attributes_local;
  
  this_00 = ParserBase::getPP(&this->super_ParserBase);
  Preprocessor::pushDesignElementStack(this_00);
  header_00 = parseModuleHeader(this);
  name._M_str._6_2_ = slang::syntax::SyntaxFacts::getModuleEndKind((header_00->moduleKeyword).kind);
  if (parentKind != CompilationUnit) {
    _local_58 = Token::valueText(&header_00->name);
    bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_58);
    if (!bVar4) {
      if ((*anyLocalModules & 1U) == 0) {
        SmallVectorBase<ska::flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
        ::emplace_back<>(&(this->moduleDeclStack).
                          super_SmallVectorBase<ska::flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                        );
        *anyLocalModules = true;
      }
      this_01 = SmallVectorBase<ska::flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                ::back(&(this->moduleDeclStack).
                        super_SmallVectorBase<ska::flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                      );
      ska::
      flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::emplace(this_01,(key_type *)local_58);
    }
  }
  parentKind_00 =
       slang::syntax::SyntaxFacts::getModuleDeclarationKind((header_00->moduleKeyword).kind);
  TVar5 = Preprocessor::getDefaultNetType(this_00);
  TVar6 = Preprocessor::getUnconnectedDrive(this_00);
  poVar7 = Preprocessor::getTimeScale(this_00);
  _Var2 = (poVar7->super__Optional_base<slang::TimeScale,_true,_true>)._M_payload.
          super__Optional_payload_base<slang::TimeScale>._M_payload;
  bVar4 = (poVar7->super__Optional_base<slang::TimeScale,_true,_true>)._M_payload.
          super__Optional_payload_base<slang::TimeScale>._M_engaged;
  SVar3 = this->currentDefinitionKind;
  this->currentDefinitionKind = parentKind_00;
  Token::Token((Token *)&members.size_);
  endName = (NamedBlockClauseSyntax *)this;
  _local_a0 = parseMemberList<slang::syntax::MemberSyntax,slang::parsing::Parser::parseModule(nonstd::span_lite::span<slang::syntax::AttributeInstanceSyntax*,18446744073709551615ul>,slang::syntax::SyntaxKind,bool&)::__0>
                        (this,name._M_str._6_2_,(Token *)&members.size_,parentKind_00,
                         (anon_class_8_1_8991fb9c *)&endName);
  this->currentDefinitionKind = SVar3;
  Preprocessor::popDesignElementStack(this_00);
  local_b0 = parseNamedBlockClause(this);
  pTVar1 = &header_00->name;
  result = *(ModuleDeclarationSyntax **)pTVar1;
  local_b8 = (header_00->name).info;
  nameToken.kind = pTVar1->kind;
  nameToken._2_1_ = pTVar1->field_0x2;
  nameToken.numFlags.raw = (pTVar1->numFlags).raw;
  nameToken.rawLen = pTVar1->rawLen;
  nameToken.info = pTVar1->info;
  checkBlockNames(this,nameToken,local_b0);
  local_108 = attributes.data_;
  local_100 = attributes.size_;
  slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
            (&local_f8,attributes);
  local_148 = (pointer)local_a0;
  local_140 = members.data_;
  slang::syntax::SyntaxList<slang::syntax::MemberSyntax>::SyntaxList(&local_138,_local_a0);
  local_158 = members.size_;
  endmodule_00.info = (Info *)endmodule._0_8_;
  endmodule_00.kind = (undefined2)members.size_;
  endmodule_00._2_1_ = members.size_._2_1_;
  endmodule_00.numFlags.raw = members.size_._3_1_;
  endmodule_00.rawLen = members.size_._4_4_;
  local_160 = slang::syntax::SyntaxFactory::moduleDeclaration
                        (&this->factory,parentKind_00,&local_f8,header_00,&local_138,endmodule_00,
                         local_b0);
  local_c8 = local_160;
  pNVar8 = ska::
           flat_hash_map<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node,_slang::Hasher<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>_>_>
           ::operator[](&(this->meta).nodeMap,(SyntaxNode **)&local_160);
  pNVar8->defaultNetType = TVar5;
  pNVar8->unconnectedDrive = TVar6;
  (pNVar8->timeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
  super__Optional_payload_base<slang::TimeScale>._M_payload = _Var2;
  (pNVar8->timeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
  super__Optional_payload_base<slang::TimeScale>._M_engaged = bVar4;
  return local_c8;
}

Assistant:

ModuleDeclarationSyntax& Parser::parseModule(AttrList attributes, SyntaxKind parentKind,
                                             bool& anyLocalModules) {
    // Tell the preprocessor that we're inside a design element for the duration of this function.
    auto& pp = getPP();
    pp.pushDesignElementStack();

    auto& header = parseModuleHeader();
    auto endKind = getModuleEndKind(header.moduleKeyword.kind);

    // If the parent isn't a compilation unit, that means we're a nested definition.
    // Record our name in the decl stack so that child instantiations know they're
    // referencing a local module and not a global one.
    if (parentKind != SyntaxKind::CompilationUnit) {
        auto name = header.name.valueText();
        if (!name.empty()) {
            if (!anyLocalModules) {
                moduleDeclStack.emplace_back();
                anyLocalModules = true;
            }
            moduleDeclStack.back().emplace(name);
        }
    }

    SyntaxKind declKind = getModuleDeclarationKind(header.moduleKeyword.kind);
    ParserMetadata::Node node{pp.getDefaultNetType(), pp.getUnconnectedDrive(), pp.getTimeScale()};

    auto savedDefinitionKind = currentDefinitionKind;
    currentDefinitionKind = declKind;

    Token endmodule;
    auto members = parseMemberList<MemberSyntax>(
        endKind, endmodule, declKind, [this](SyntaxKind parentKind, bool& anyLocalModules) {
            return parseMember(parentKind, anyLocalModules);
        });

    currentDefinitionKind = savedDefinitionKind;
    pp.popDesignElementStack();

    auto endName = parseNamedBlockClause();
    checkBlockNames(header.name, endName);

    auto& result = factory.moduleDeclaration(declKind, attributes, header, members, endmodule,
                                             endName);

    meta.nodeMap[&result] = node;
    return result;
}